

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O1

base_learner * cbifyldf_setup(options_i *options,vw *all)

{
  float *pfVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  vw *all_00;
  int iVar4;
  cbify *pcVar5;
  option_group_definition *poVar6;
  typed_option<float> *ptVar7;
  base_learner *l;
  multi_learner *base;
  learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar8;
  long lVar9;
  undefined **ppuVar10;
  label_parser *plVar11;
  byte bVar12;
  float fVar13;
  float fVar14;
  bool cbify_ldf_option;
  size_type __dnew_3;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_2;
  bool local_619;
  cbify *local_618;
  float *local_610;
  vw *local_608;
  _func_int ***local_600;
  _func_int **local_5f8;
  _func_int **local_5f0 [2];
  float *local_5e0;
  long local_5d8;
  _func_int ***local_5d0;
  _func_int **local_5c8;
  _func_int **local_5c0 [2];
  _func_int ***local_5b0;
  _func_int **local_5a8;
  _func_int **local_5a0 [2];
  string local_590;
  string local_570;
  undefined1 local_550 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_538 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b8;
  option_group_definition local_4b0;
  long *local_478;
  long local_470;
  long local_468 [2];
  string local_458;
  undefined1 local_438 [112];
  bool local_3c8;
  ios_base local_3b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<bool> local_d0;
  
  bVar12 = 0;
  pcVar5 = calloc_or_throw<cbify>(1);
  memset(pcVar5,0,0xd0);
  local_619 = false;
  local_438._0_8_ = (_func_int **)0x25;
  local_618 = pcVar5;
  local_600 = local_5f0;
  local_600 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_600,(ulong)local_438);
  local_5f0[0] = (_func_int **)local_438._0_8_;
  local_600[2] = (_func_int **)0x746e6f43206f746e;
  local_600[3] = (_func_int **)0x42206c6175747865;
  *local_600 = (_func_int **)0x6f736320656b614d;
  local_600[1] = (_func_int **)0x692066646c5f6161;
  builtin_strncpy((char *)((long)local_600 + 0x1d),"l Bandit",8);
  local_5f8 = (_func_int **)local_438._0_8_;
  *(char *)((long)local_600 + local_438._0_8_) = '\0';
  local_4b0.m_name._M_dataplus._M_p = (pointer)&local_4b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b0,local_600,(char *)(local_438._0_8_ + (long)local_600));
  local_4b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_600 != local_5f0) {
    operator_delete(local_600);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  local_570.field_2._M_allocated_capacity = 0x646c5f7966696263;
  local_570.field_2._8_2_ = 0x66;
  local_570._M_string_length = 9;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_438,&local_570,&local_619);
  local_3c8 = true;
  local_5b0 = local_5a0;
  local_550._0_8_ = (_func_int **)0x32;
  local_5b0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5b0,(ulong)local_550);
  local_5a0[0] = (_func_int **)local_550._0_8_;
  local_5b0[4] = (_func_int **)0x646e6162206c6175;
  local_5b0[5] = (_func_int **)0x6c626f7270207469;
  local_5b0[2] = (_func_int **)0x61206f746e692066;
  local_5b0[3] = (_func_int **)0x747865746e6f6320;
  *local_5b0 = (_func_int **)0x20747265766e6f43;
  local_5b0[1] = (_func_int **)0x646c5f61616f7363;
  *(undefined2 *)(local_5b0 + 6) = 0x6d65;
  local_5a8 = (_func_int **)local_550._0_8_;
  *(char *)((long)local_5b0 + local_550._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_438 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_438);
  poVar6 = VW::config::option_group_definition::add<bool>(&local_4b0,&local_d0);
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  local_590.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_590.field_2._M_allocated_capacity._4_2_ = 0x30;
  local_590._M_string_length = 5;
  local_610 = &pcVar5->loss0;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_550,&local_590,local_610);
  ptVar7 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_550,0.0);
  local_5d0 = local_5c0;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)0x16;
  local_608 = all;
  local_5d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5d0,(ulong)&local_2b0);
  local_5c0[0] = local_2b0.super_base_option._vptr_base_option;
  *local_5d0 = (_func_int **)0x726f662073736f6c;
  local_5d0[1] = (_func_int **)0x74636572726f6320;
  builtin_strncpy((char *)((long)local_5d0 + 0xe),"ct label",8);
  local_5c8 = local_2b0.super_base_option._vptr_base_option;
  *(char *)((long)local_5d0 + (long)local_2b0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar7);
  poVar6 = VW::config::option_group_definition::add<float>(poVar6,&local_170);
  local_458.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_458.field_2._M_allocated_capacity._4_2_ = 0x31;
  local_458._M_string_length = 5;
  pfVar1 = &local_618->loss1;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  VW::config::typed_option<float>::typed_option(&local_2b0,&local_458,pfVar1);
  local_5e0 = pfVar1;
  ptVar7 = VW::config::typed_option<float>::default_value(&local_2b0,1.0);
  local_5d8 = 0x18;
  local_478 = local_468;
  local_478 = (long *)std::__cxx11::string::_M_create((ulong *)&local_478,(ulong)&local_5d8);
  local_468[0] = local_5d8;
  *local_478 = 0x726f662073736f6c;
  local_478[1] = 0x6572726f636e6920;
  local_478[2] = 0x6c6562616c207463;
  local_470 = local_5d8;
  *(char *)((long)local_478 + local_5d8) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar7);
  VW::config::option_group_definition::add<float>(poVar6,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffa0;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_478 != local_468) {
    operator_delete(local_478);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffa0;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffa0;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_5d0 != local_5c0) {
    operator_delete(local_5d0);
  }
  local_550._0_8_ = &PTR__typed_option_002cffa0;
  if (local_4b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b8._M_pi);
  }
  if (local_4c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_550);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffd8;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  local_438._0_8_ = &PTR__typed_option_002cffd8;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_4b0);
  pp_Var2 = (_func_int **)(local_438 + 0x10);
  local_438._16_6_ = 0x5f7966696263;
  local_438[0x16] = 0x6c;
  local_438[0x17] = 100;
  local_438[0x18] = 'f';
  local_438[0x19] = '\0';
  local_438._8_8_ = (pointer)0x9;
  local_438._0_8_ = pp_Var2;
  iVar4 = (*options->_vptr_options_i[1])(options,local_438);
  if ((_func_int **)local_438._0_8_ != pp_Var2) {
    operator_delete((void *)local_438._0_8_);
  }
  if ((char)iVar4 == '\0') {
    plVar8 = (learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    pcVar5 = local_618;
  }
  else {
    local_618->app_seed = 0x337ad8c;
    local_618->all = local_608;
    local_438._16_6_ = 0x7078655f6263;
    local_438[0x16] = 0x6c;
    local_438[0x17] = 0x6f;
    local_438[0x18] = 'r';
    local_438[0x19] = 'e';
    local_438[0x1a] = '_';
    local_438[0x1b] = 'a';
    local_438._28_2_ = 0x6664;
    local_438._8_8_ = (pointer)0xe;
    local_438[0x1e] = '\0';
    local_438._0_8_ = pp_Var2;
    iVar4 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_438._0_8_ != pp_Var2) {
      operator_delete((void *)local_438._0_8_);
    }
    if ((char)iVar4 == '\0') {
      local_438._16_6_ = 0x7078655f6263;
      local_438[0x16] = 0x6c;
      local_438[0x17] = 0x6f;
      local_438[0x18] = 'r';
      local_438[0x19] = 'e';
      local_438[0x1a] = '_';
      local_438[0x1b] = 'a';
      local_438._28_2_ = 0x6664;
      local_438._8_8_ = (pointer)0xe;
      local_438[0x1e] = '\0';
      local_550._8_8_ = (pointer)0x0;
      local_550[0x10] = '\0';
      local_550._0_8_ = local_550 + 0x10;
      local_438._0_8_ = pp_Var2;
      (*options->_vptr_options_i[5])(options,local_438,local_550);
      if ((undefined1 *)local_550._0_8_ != local_550 + 0x10) {
        operator_delete((void *)local_550._0_8_);
      }
      if ((_func_int **)local_438._0_8_ != pp_Var2) {
        operator_delete((void *)local_438._0_8_);
      }
    }
    local_438._16_6_ = 0x6e696d5f6263;
    local_438[0x16] = 0x5f;
    local_438[0x17] = 99;
    local_438[0x18] = 'o';
    local_438[0x19] = 's';
    local_438[0x1a] = 't';
    local_438._8_8_ = (pointer)0xb;
    local_438[0x1b] = '\0';
    local_438._0_8_ = pp_Var2;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550,
               vsnprintf,0x3a,"%f",(double)*local_610);
    (*options->_vptr_options_i[5])(options,local_438,local_550);
    pfVar1 = local_5e0;
    pp_Var3 = (_func_int **)(local_550 + 0x10);
    if ((_func_int **)local_550._0_8_ != pp_Var3) {
      operator_delete((void *)local_550._0_8_);
    }
    if ((_func_int **)local_438._0_8_ != pp_Var2) {
      operator_delete((void *)local_438._0_8_);
    }
    local_438._16_6_ = 0x78616d5f6263;
    local_438[0x16] = 0x5f;
    local_438[0x17] = 99;
    local_438[0x18] = 'o';
    local_438[0x19] = 's';
    local_438[0x1a] = 't';
    local_438._8_8_ = (pointer)0xb;
    local_438[0x1b] = '\0';
    local_438._0_8_ = pp_Var2;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550,
               vsnprintf,0x3a,"%f",(double)*pfVar1);
    (*options->_vptr_options_i[5])(options,local_438,local_550);
    if ((_func_int **)local_550._0_8_ != pp_Var3) {
      operator_delete((void *)local_550._0_8_);
    }
    if ((_func_int **)local_438._0_8_ != pp_Var2) {
      operator_delete((void *)local_438._0_8_);
    }
    local_438._16_6_ = 0x696c65736162;
    local_438[0x16] = 0x6e;
    local_438[0x17] = 0x65;
    local_438._8_8_ = (pointer)0x8;
    local_438[0x18] = '\0';
    local_438._0_8_ = pp_Var2;
    iVar4 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_438._0_8_ != pp_Var2) {
      operator_delete((void *)local_438._0_8_);
    }
    all_00 = local_608;
    pcVar5 = local_618;
    if ((char)iVar4 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_438);
      fVar13 = ABS(*local_610);
      fVar14 = ABS(local_610[1]);
      if (fVar14 <= fVar13) {
        fVar14 = fVar13;
      }
      std::ostream::_M_insert<double>((double)(fVar14 / (local_610[1] - *local_610)));
      local_550[0x10] = 'l';
      local_550._17_4_ = 0x756d5f72;
      local_550._21_3_ = 0x69746c;
      aaStack_538[0]._M_allocated_capacity._0_5_ = 0x7265696c70;
      local_550._8_8_ = (pointer)0xd;
      aaStack_538[0]._M_local_buf[5] = '\0';
      local_550._0_8_ = pp_Var3;
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_550,&local_2b0);
      if (local_2b0.super_base_option._vptr_base_option !=
          (_func_int **)&local_2b0.super_base_option.m_name._M_string_length) {
        operator_delete(local_2b0.super_base_option._vptr_base_option);
      }
      if ((_func_int **)local_550._0_8_ != pp_Var3) {
        operator_delete((void *)local_550._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_438);
      std::ios_base::~ios_base(local_3b8);
    }
    l = setup_base(options,all_00);
    base = LEARNER::as_multiline<char,char>(l);
    plVar8 = LEARNER::learner<cbify,std::vector<example*,std::allocator<example*>>>::
             init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                       (pcVar5,base,do_actual_learning_ldf<true>,do_actual_learning_ldf<false>,1,
                        multiclass);
    *(undefined8 *)(plVar8 + 0xb8) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0xc0) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 200) = finish;
    *(undefined8 *)(plVar8 + 0x58) = *(undefined8 *)(plVar8 + 0x18);
    *(code **)(plVar8 + 0x68) = finish_multiline_example;
    ppuVar10 = &COST_SENSITIVE::cs_label;
    plVar11 = &all_00->p->lp;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      plVar11->default_label = (_func_void_void_ptr *)*ppuVar10;
      ppuVar10 = ppuVar10 + (ulong)bVar12 * -2 + 1;
      plVar11 = (label_parser *)((long)plVar11 + (ulong)bVar12 * -0x10 + 8);
    }
    all_00->delete_prediction = (_func_void_void_ptr *)0x0;
    pcVar5 = (cbify *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_4b0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0.m_name._M_dataplus._M_p != &local_4b0.m_name.field_2) {
    operator_delete(local_4b0.m_name._M_dataplus._M_p);
  }
  if (pcVar5 != (cbify *)0x0) {
    destroy_free<cbify>(pcVar5);
  }
  return (base_learner *)plVar8;
}

Assistant:

base_learner* cbifyldf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cbify>();
  bool cbify_ldf_option = false;

  option_group_definition new_options("Make csoaa_ldf into Contextual Bandit");
  new_options
      .add(make_option("cbify_ldf", cbify_ldf_option).keep().help("Convert csoaa_ldf into a contextual bandit problem"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify_ldf"))
    return nullptr;

  data->app_seed = uniform_hash("vw", 2, 0);
  data->all = &all;

  if (!options.was_supplied("cb_explore_adf"))
  {
    options.insert("cb_explore_adf", "");
  }
  options.insert("cb_min_cost", to_string(data->loss0));
  options.insert("cb_max_cost", to_string(data->loss1));

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  learner<cbify,multi_ex>& l = init_learner(data, base, do_actual_learning_ldf<true>, do_actual_learning_ldf<false>, 1, prediction_type::multiclass);

  l.set_finish(finish);
  l.set_finish_example(finish_multiline_example);
  all.p->lp = COST_SENSITIVE::cs_label;
  all.delete_prediction = nullptr;

  return make_base(l);
}